

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_cmac.cpp
# Opt level: O0

void ot::commissioner::otPbkdf2Cmac
               (uint8_t *aPassword,uint16_t aPasswordLen,uint8_t *aSalt,uint16_t aSaltLen,
               uint32_t aIterationCounter,uint16_t aKeyLen,uint8_t *aKey)

{
  size_t local_c0;
  uint local_b8;
  uint local_b4;
  uint32_t j_1;
  uint32_t i;
  uint32_t j;
  uint16_t useLen;
  uint16_t keyLen;
  uint8_t *key;
  uint32_t blockCounter;
  long keyBlock [2];
  long prfTwo [2];
  long prfOne [2];
  uint8_t prfInput [34];
  size_t kBlockSize;
  uint16_t aKeyLen_local;
  uint32_t aIterationCounter_local;
  uint16_t aSaltLen_local;
  uint8_t *aSalt_local;
  uint16_t aPasswordLen_local;
  uint8_t *aPassword_local;
  
  key._4_4_ = 0;
  _j = aKey;
  memcpy(prfOne + 1,aSalt,(ulong)aSaltLen);
  if ((aIterationCounter & 1) == 0) {
    for (i._2_2_ = aKeyLen; i._2_2_ != 0; i._2_2_ = i._2_2_ - (ushort)local_c0) {
      key._4_4_ = key._4_4_ + 1;
      *(char *)((long)prfOne + (long)(int)(uint)aSaltLen + 8) = (char)((uint)key._4_4_ >> 0x18);
      *(char *)((long)prfOne + (long)(int)(aSaltLen + 1) + 8) = (char)((uint)key._4_4_ >> 0x10);
      *(char *)((long)prfOne + (long)(int)(aSaltLen + 2) + 8) = (char)((uint)key._4_4_ >> 8);
      *(char *)((long)prfOne + (long)(int)(aSaltLen + 3) + 8) = (char)key._4_4_;
      mbedtls_aes_cmac_prf_128
                (aPassword,(ulong)aPasswordLen,(uchar *)(prfOne + 1),(long)(int)(aSaltLen + 4),
                 &stack0xffffffffffffff68);
      mbedtls_aes_cmac_prf_128
                (aPassword,(ulong)aPasswordLen,&stack0xffffffffffffff68,0x10,(uchar *)(prfTwo + 1));
      for (j_1 = 0; j_1 < 2; j_1 = j_1 + 1) {
        *(ulong *)(&stack0xffffffffffffff68 + (ulong)j_1 * 8) =
             prfTwo[(ulong)j_1 + 1] ^ *(ulong *)(&stack0xffffffffffffff68 + (ulong)j_1 * 8);
      }
      for (local_b4 = 1; local_b4 < aIterationCounter >> 1; local_b4 = local_b4 + 1) {
        mbedtls_aes_cmac_prf_128
                  (aPassword,(ulong)aPasswordLen,(uchar *)(prfTwo + 1),0x10,(uchar *)(keyBlock + 1))
        ;
        mbedtls_aes_cmac_prf_128
                  (aPassword,(ulong)aPasswordLen,(uchar *)(keyBlock + 1),0x10,(uchar *)(prfTwo + 1))
        ;
        for (local_b8 = 0; local_b8 < 2; local_b8 = local_b8 + 1) {
          *(ulong *)(&stack0xffffffffffffff68 + (ulong)local_b8 * 8) =
               prfTwo[(ulong)local_b8 + 1] ^ keyBlock[(ulong)local_b8 + 1] ^
               *(ulong *)(&stack0xffffffffffffff68 + (ulong)local_b8 * 8);
        }
      }
      if (i._2_2_ < 0x10) {
        local_c0 = (size_t)i._2_2_;
      }
      else {
        local_c0 = 0x10;
      }
      memcpy(_j,&stack0xffffffffffffff68,local_c0);
      _j = _j + (int)(uint)(ushort)local_c0;
    }
    return;
  }
  __assert_fail("aIterationCounter % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/pbkdf2_cmac.cpp"
                ,0x44,
                "void ot::commissioner::otPbkdf2Cmac(const uint8_t *, uint16_t, const uint8_t *, uint16_t, uint32_t, uint16_t, uint8_t *)"
               );
}

Assistant:

void otPbkdf2Cmac(const uint8_t *aPassword,
                  uint16_t       aPasswordLen,
                  const uint8_t *aSalt,
                  uint16_t       aSaltLen,
                  uint32_t       aIterationCounter,
                  uint16_t       aKeyLen,
                  uint8_t       *aKey)
{
    const size_t kBlockSize = MBEDTLS_CIPHER_BLKSIZE_MAX;
    uint8_t      prfInput[OT_PBKDF2_SALT_MAX_LEN + 4]; // Salt || INT(), for U1 calculation
    long         prfOne[kBlockSize / sizeof(long)];
    long         prfTwo[kBlockSize / sizeof(long)];
    long         keyBlock[kBlockSize / sizeof(long)];
    uint32_t     blockCounter = 0;
    uint8_t     *key          = aKey;
    uint16_t     keyLen       = aKeyLen;
    uint16_t     useLen       = 0;

    memcpy(prfInput, aSalt, aSaltLen);
    assert(aIterationCounter % 2 == 0);
    aIterationCounter /= 2;

    while (keyLen)
    {
        ++blockCounter;
        prfInput[aSaltLen + 0] = static_cast<uint8_t>(blockCounter >> 24);
        prfInput[aSaltLen + 1] = static_cast<uint8_t>(blockCounter >> 16);
        prfInput[aSaltLen + 2] = static_cast<uint8_t>(blockCounter >> 8);
        prfInput[aSaltLen + 3] = static_cast<uint8_t>(blockCounter);

        // Calculate U_1
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, prfInput, aSaltLen + 4,
                                 reinterpret_cast<uint8_t *>(keyBlock));

        // Calculate U_2
        mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(keyBlock), kBlockSize,
                                 reinterpret_cast<uint8_t *>(prfOne));

        for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
        {
            keyBlock[j] ^= prfOne[j];
        }

        for (uint32_t i = 1; i < aIterationCounter; ++i)
        {
            // Calculate U_{2 * i - 1}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfOne), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfTwo));
            // Calculate U_{2 * i}
            mbedtls_aes_cmac_prf_128(aPassword, aPasswordLen, reinterpret_cast<const uint8_t *>(prfTwo), kBlockSize,
                                     reinterpret_cast<uint8_t *>(prfOne));

            for (uint32_t j = 0; j < kBlockSize / sizeof(long); ++j)
            {
                keyBlock[j] ^= prfOne[j] ^ prfTwo[j];
            }
        }

        useLen = (keyLen < kBlockSize) ? keyLen : kBlockSize;
        memcpy(key, keyBlock, useLen);
        key += useLen;
        keyLen -= useLen;
    }
}